

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsSamplers.h
# Opt level: O2

PointVector * __thiscall
chrono::utils::GridSampler<double>::Sample
          (PointVector *__return_storage_ptr__,GridSampler<double> *this,VolumeType t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  socklen_t *__addr_len;
  int iVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined8 in_XMM3_Qb;
  undefined8 uVar15;
  ChVector<double> v;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  sockaddr local_48;
  double local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar7 = *(undefined1 (*) [16])(this->super_Sampler<double>).m_size.m_data;
  dVar1 = (this->super_Sampler<double>).m_size.m_data[2];
  auVar8 = vsubpd_avx(*(undefined1 (*) [16])(this->super_Sampler<double>).m_center.m_data,auVar7);
  dVar2 = (this->super_Sampler<double>).m_center.m_data[2];
  dVar14 = auVar7._0_8_;
  dVar3 = (this->m_sep3D).m_data[0];
  dVar4 = (this->super_Sampler<double>).m_size.m_data[1];
  dVar5 = (this->m_sep3D).m_data[1];
  dVar6 = (this->m_sep3D).m_data[2];
  for (iVar9 = 0; iVar9 <= (int)((dVar14 + dVar14) / dVar3); iVar9 = iVar9 + 1) {
    __addr_len = (socklen_t *)0x0;
    uVar15 = in_XMM3_Qb;
    while (iVar11 = (int)__addr_len, iVar11 <= (int)((dVar4 + dVar4) / dVar5)) {
      auVar7._8_8_ = in_XMM3_Qb;
      auVar7._0_8_ = (double)iVar9;
      auVar13._0_8_ = (double)iVar11;
      auVar13._8_8_ = uVar15;
      iVar12 = 0;
      auVar7 = vunpcklpd_avx(auVar7,auVar13);
      for (; iVar12 <= (int)((dVar1 + dVar1) / dVar6); iVar12 = iVar12 + 1) {
        local_58 = auVar7._0_8_;
        dStack_50 = auVar7._8_8_;
        local_38 = (double)iVar12 * (this->m_sep3D).m_data[2] + (dVar2 - dVar1);
        local_68 = auVar8._0_8_;
        dStack_60 = auVar8._8_8_;
        local_48._0_8_ = local_58 * (this->m_sep3D).m_data[0] + local_68;
        local_48.sa_data._6_8_ = dStack_50 * (this->m_sep3D).m_data[1] + dStack_60;
        iVar10 = Sampler<double>::accept(&this->super_Sampler<double>,t,&local_48,__addr_len);
        if ((char)iVar10 != '\0') {
          std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
          push_back(__return_storage_ptr__,(value_type *)&local_48);
        }
      }
      __addr_len = (socklen_t *)(ulong)(iVar11 + 1);
    }
    in_XMM3_Qb = uVar15;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual PointVector Sample(VolumeType t) override {
        PointVector out_points;

        ChVector<T> bl = this->m_center - this->m_size;

        int nx = (int)(2 * this->m_size.x() / m_sep3D.x()) + 1;
        int ny = (int)(2 * this->m_size.y() / m_sep3D.y()) + 1;
        int nz = (int)(2 * this->m_size.z() / m_sep3D.z()) + 1;

        for (int i = 0; i < nx; i++) {
            for (int j = 0; j < ny; j++) {
                for (int k = 0; k < nz; k++) {
                    ChVector<T> p = bl + ChVector<T>(i * m_sep3D.x(), j * m_sep3D.y(), k * m_sep3D.z());
                    if (this->accept(t, p))
                        out_points.push_back(p);
                }
            }
        }

        return out_points;
    }